

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm.c
# Opt level: O3

void write_ppm(char *filename,IceTUByte *image,int width,int height)

{
  bool bVar1;
  FILE *__s;
  IceTUByte *__ptr;
  int iVar2;
  ulong uVar3;
  
  __s = fopen(filename,"wb");
  fwrite("P6\n",3,1,__s);
  fprintf(__s,"# %s generated by IceT test suite.\n",filename);
  fprintf(__s,"%d %d\n",(ulong)(uint)width,(ulong)(uint)height);
  fwrite("255\n",4,1,__s);
  if (0 < height) {
    uVar3 = (ulong)(uint)height;
    do {
      if (0 < width) {
        __ptr = image + width * 4 * (int)(uVar3 - 1);
        iVar2 = width;
        do {
          fwrite(__ptr,1,3,__s);
          __ptr = __ptr + 4;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      bVar1 = 1 < (long)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar1);
  }
  fclose(__s);
  return;
}

Assistant:

void write_ppm(const char *filename,
               const IceTUByte *image,
               int width, int height)
{
    FILE *fd;
    int x, y;
    const unsigned char *color;

    fd = fopen(filename, "wb");

    fprintf(fd, "P6\n");
    fprintf(fd, "# %s generated by IceT test suite.\n", filename);
    fprintf(fd, "%d %d\n", width, height);
    fprintf(fd, "255\n");

    for (y = height-1; y >= 0; y--) {
        color = image + y*width*4;
        for (x = 0; x < width; x++) {
            fwrite(color, 1, 3, fd);
            color += 4;
        }
    }

    fclose(fd);
}